

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::piece_picker::is_piece_free
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask)

{
  pointer ppVar1;
  bool bVar2;
  
  bVar2 = bitfield::get_bit(&bitmask->super_bitfield,piece.m_val);
  if (bVar2) {
    ppVar1 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((prio_index_t *)((long)(ppVar1 + piece.m_val) + 4))->m_val != -1) {
      return 0x1fffffff < *(uint *)(ppVar1 + piece.m_val);
    }
  }
  return false;
}

Assistant:

bool piece_picker::is_piece_free(piece_index_t const piece
		, typed_bitfield<piece_index_t> const& bitmask) const
	{
		return bitmask[piece]
			&& !m_piece_map[piece].have()
			&& !m_piece_map[piece].filtered();
	}